

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DrawMeshIndirect
          (VulkanCommandBuffer *this,VkBuffer Buffer,VkDeviceSize Offset,uint32_t DrawCount,
          uint32_t Stride)

{
  undefined4 in_register_0000000c;
  string msg;
  string local_50;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,DrawCount));
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"DrawMeshIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xce);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (((this->m_State).RenderPass == (VkRenderPass)0x0) &&
     ((this->m_State).DynamicRenderingHash == 0)) {
    Diligent::FormatString<char[66]>
              (&local_50,
               (char (*) [66])"vkCmdDrawMeshTasksIndirectEXT() must be called inside render pass");
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"DrawMeshIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xcf);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>(&local_50,(char (*) [27])"No graphics pipeline bound");
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"DrawMeshIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xd0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  (*vkCmdDrawMeshTasksIndirectEXT)(this->m_VkCmdBuffer,Buffer,Offset,DrawCount,Stride);
  return;
}

Assistant:

__forceinline void DrawMeshIndirect(VkBuffer Buffer, VkDeviceSize Offset, uint32_t DrawCount, uint32_t Stride)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(), "vkCmdDrawMeshTasksIndirectEXT() must be called inside render pass");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");

        vkCmdDrawMeshTasksIndirectEXT(m_VkCmdBuffer, Buffer, Offset, DrawCount, Stride);
#else
        UNSUPPORTED("DrawMeshIndirect is not supported when vulkan library is linked statically");
#endif
    }